

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O3

Abc_Obj_t * Abc_NtkCreateNodeConst0(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  Mio_Gate_t *pMVar2;
  DdNode *n;
  Mio_Library_t *pLib;
  
  if (1 < pNtk->ntkType - ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x266,"Abc_Obj_t *Abc_NtkCreateNodeConst0(Abc_Ntk_t *)");
  }
  pAVar1 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
  switch(pNtk->ntkFunc) {
  case ABC_FUNC_SOP:
  case ABC_FUNC_BLIFMV:
    pMVar2 = (Mio_Gate_t *)Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc," 0\n");
    break;
  case ABC_FUNC_BDD:
    n = Cudd_ReadLogicZero((DdManager *)pNtk->pManFunc);
    (pAVar1->field_5).pData = n;
    Cudd_Ref(n);
    return pAVar1;
  case ABC_FUNC_AIG:
    pMVar2 = (Mio_Gate_t *)(*(ulong *)((long)pNtk->pManFunc + 0x18) ^ 1);
    break;
  case ABC_FUNC_MAP:
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    pMVar2 = Mio_LibraryReadConst0(pLib);
    break;
  case ABC_FUNC_BLACKBOX:
    goto switchD_001f225a_caseD_6;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x273,"Abc_Obj_t *Abc_NtkCreateNodeConst0(Abc_Ntk_t *)");
  }
  (pAVar1->field_5).pData = pMVar2;
switchD_001f225a_caseD_6:
  return pAVar1;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateNodeConst0( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk) );
    pNode = Abc_NtkCreateNode( pNtk );   
    if ( Abc_NtkHasSop(pNtk) || Abc_NtkHasBlifMv(pNtk) )
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, " 0\n" );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNode->pData = Cudd_ReadLogicZero((DdManager *)pNtk->pManFunc), Cudd_Ref( (DdNode *)pNode->pData );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNode->pData = Hop_ManConst0((Hop_Man_t *)pNtk->pManFunc);
    else if ( Abc_NtkHasMapping(pNtk) )
        pNode->pData = Mio_LibraryReadConst0((Mio_Library_t *)Abc_FrameReadLibGen());
    else if ( !Abc_NtkHasBlackbox(pNtk) )
        assert( 0 );
    return pNode;
}